

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.h
# Opt level: O0

void __thiscall testing::internal::FilePath::FilePath(FilePath *this,string *pathname)

{
  string *pathname_local;
  FilePath *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)pathname);
  Normalize(this);
  return;
}

Assistant:

explicit FilePath(std::string pathname) : pathname_(std::move(pathname)) {
    Normalize();
  }